

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

void __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::~hamt_map(hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
            *this)

{
  if (((ulong)(this->root_).internal_ & 2) != 0) {
    clear(this,this->root_,0);
    (this->root_).internal_ = (internal_node *)0x0;
  }
  std::
  unique_ptr<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
  ::~unique_ptr(&this->internals_container_);
  return;
}

Assistant:

~hamt_map () override { this->clear (); }